

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ecdsa_adaptor.cpp
# Opt level: O1

void __thiscall ECDSAAdaptor_ExtractSecret_Test::TestBody(ECDSAAdaptor_ExtractSecret_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  Privkey sec;
  ByteData raw_sig;
  SigHashType sig_hash;
  string local_a8;
  internal local_88 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  string local_78;
  Privkey local_58;
  ByteData local_38;
  SigHashType local_1c;
  
  cfd::core::SigHashType::SigHashType(&local_1c);
  cfd::core::CryptoUtil::ConvertSignatureFromDer(&local_38,&sig_der,&local_1c);
  cfd::core::AdaptorUtil::ExtractSecret(&local_58,&adaptor_sig2,&local_38,&adaptor);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_a8,&secret);
  cfd::core::Privkey::GetHex_abi_cxx11_(&local_78,&local_58);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_88,"secret.GetHex()","sec.GetHex()",&local_a8,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    if (local_80.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_80.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_ecdsa_adaptor.cpp"
               ,0x47,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    if ((long *)local_a8._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_a8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_a8._M_dataplus._M_p + 8))();
      }
      local_a8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(ECDSAAdaptor, ExtractSecret) {
  SigHashType sig_hash;
  auto raw_sig = CryptoUtil::ConvertSignatureFromDer(sig_der, &sig_hash);

  auto sec = AdaptorUtil::ExtractSecret(adaptor_sig2, raw_sig, adaptor);

  EXPECT_EQ(secret.GetHex(), sec.GetHex());
}